

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O2

Test * CLParserTestParseFilenameFilter::Create(void)

{
  g_current_test = (Test *)operator_new(0x10);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test->_vptr_Test = (_func_int **)&PTR__Test_001e13a0;
  return g_current_test;
}

Assistant:

TEST(CLParserTest, ParseFilenameFilter) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo.cc\r\n"
      "cl: warning\r\n",
      "", &output, &err));
  ASSERT_EQ("cl: warning\n", output);
}